

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserCreateView.cpp
# Opt level: O0

void __thiscall UserCreateView::display(UserCreateView *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  UserCreateUpdateForm *this_00;
  undefined4 extraout_var;
  Controller *this_01;
  View *pVVar4;
  allocator local_299;
  string local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 local_218 [8];
  BaseUser user;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [55];
  byte local_91;
  undefined1 local_90 [7];
  bool adminStatus;
  string password;
  string email;
  string lastName;
  string firstName;
  UserCreateView *this_local;
  
  std::operator<<((ostream *)&std::cout,"To create a new user fill in the details asked below: \n");
  std::__cxx11::string::string((string *)(lastName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(email.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(password.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_90);
  std::operator<<((ostream *)&std::cout,"First name: ");
  Input::getString_abi_cxx11_();
  std::__cxx11::string::operator=((string *)(lastName.field_2._M_local_buf + 8),local_c8);
  std::__cxx11::string::~string(local_c8);
  std::operator<<((ostream *)&std::cout,"Last name: ");
  Input::getString_abi_cxx11_();
  std::__cxx11::string::operator=((string *)(email.field_2._M_local_buf + 8),local_e8);
  std::__cxx11::string::~string(local_e8);
  std::operator<<((ostream *)&std::cout,"Email: ");
  Input::getEmail_abi_cxx11_();
  std::__cxx11::string::operator=((string *)(password.field_2._M_local_buf + 8),local_108);
  std::__cxx11::string::~string(local_108);
  std::operator<<((ostream *)&std::cout,"Password: ");
  Input::getPassword_abi_cxx11_();
  std::__cxx11::string::operator=((string *)local_90,(string *)(user.password + 0x3c));
  std::__cxx11::string::~string((string *)(user.password + 0x3c));
  std::operator<<((ostream *)&std::cout,"Should this user be an admin? (y/n): ");
  cVar1 = Input::getChar();
  local_91 = cVar1 == 'y';
  this_00 = (UserCreateUpdateForm *)operator_new(0xb0);
  UserCreateUpdateForm::UserCreateUpdateForm
            (this_00,(string *)((long)&lastName.field_2 + 8),(string *)((long)&email.field_2 + 8),
             (string *)((long)&password.field_2 + 8),(string *)local_90,(bool)(local_91 & 1),
             (BaseUser *)0x0);
  (this->super_CreateView<BaseUser>).form = (ModelForm<BaseUser> *)this_00;
  bVar2 = Form::isValid(&((this->super_CreateView<BaseUser>).form)->super_Form);
  if (bVar2) {
    iVar3 = (*(((this->super_CreateView<BaseUser>).form)->super_Form)._vptr_Form[1])();
    BaseUser::BaseUser((BaseUser *)local_218,(BaseUser *)CONCAT44(extraout_var,iVar3));
    BaseUser::getFullName_abi_cxx11_(&local_278,(BaseUser *)local_218);
    std::operator+(&local_258,"New user, ",&local_278);
    std::operator+(&local_238,&local_258," saved successfully.\n");
    std::operator<<((ostream *)&std::cout,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_278);
  }
  else {
    Form::printErrors(&((this->super_CreateView<BaseUser>).form)->super_Form);
  }
  this_01 = Controller::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"admin-panel",&local_299);
  pVVar4 = Controller::getView(this_01,&local_298);
  View::response->view = pVVar4;
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)(password.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(email.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(lastName.field_2._M_local_buf + 8));
  return;
}

Assistant:

void UserCreateView::display() {
    cout << "To create a new user fill in the details asked below: \n";
    string firstName, lastName, email, password;
    bool adminStatus;
    cout << "First name: ";
    firstName = Input::getString();
    cout << "Last name: ";
    lastName = Input::getString();
    cout << "Email: ";
    email = Input::getEmail();
    cout << "Password: ";
    password = Input::getPassword();
    cout << "Should this user be an admin? (y/n): ";
    adminStatus = (Input::getChar() == 'y');
    form = new UserCreateUpdateForm(firstName, lastName, email, password, adminStatus);
    if (form->isValid()) {
        BaseUser user = form->save();
        cout << "New user, " + user.getFullName() + " saved successfully.\n";
    } else {
        form->printErrors();
    }
    response->view = Controller::getInstance().getView("admin-panel");
}